

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O1

void aom_h_predictor_8x4_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar6 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar8 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar9 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar10 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 uVar7;
  
  uVar1 = *(ulong *)left;
  uVar7 = (undefined1)(uVar1 >> 0x38);
  auVar5._8_6_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[0xe] = uVar7;
  auVar5[0xf] = uVar7;
  uVar7 = (undefined1)(uVar1 >> 0x30);
  auVar4._14_2_ = auVar5._14_2_;
  auVar4._8_5_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4[0xd] = uVar7;
  auVar3._13_3_ = auVar4._13_3_;
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = uVar7;
  uVar7 = (undefined1)(uVar1 >> 0x28);
  auVar2._12_4_ = auVar3._12_4_;
  auVar2._8_3_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xb] = uVar7;
  auVar10._11_5_ = auVar2._11_5_;
  auVar10._8_2_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10[10] = uVar7;
  uVar7 = (undefined1)(uVar1 >> 0x20);
  auVar9._10_6_ = auVar10._10_6_;
  auVar9[8] = 0;
  auVar9._0_8_ = uVar1;
  auVar9[9] = uVar7;
  auVar8._9_7_ = auVar9._9_7_;
  auVar8[8] = uVar7;
  auVar8._0_8_ = uVar1;
  uVar7 = (undefined1)(uVar1 >> 0x18);
  auVar6._8_8_ = auVar8._8_8_;
  auVar6[7] = uVar7;
  auVar6[6] = uVar7;
  uVar7 = (undefined1)(uVar1 >> 0x10);
  auVar6[5] = uVar7;
  auVar6[4] = uVar7;
  uVar7 = (undefined1)(uVar1 >> 8);
  auVar6[3] = uVar7;
  auVar6[2] = uVar7;
  auVar6[0] = (undefined1)uVar1;
  auVar6[1] = auVar6[0];
  auVar8 = pshuflw(in_XMM1,auVar6,0);
  auVar9 = pshuflw(in_XMM2,auVar6,0x55);
  auVar10 = pshuflw(in_XMM3,auVar6,0xaa);
  auVar6 = pshuflw(auVar6,auVar6,0xff);
  *(long *)dst = auVar8._0_8_;
  *(long *)(dst + stride) = auVar9._0_8_;
  *(long *)(dst + stride * 2) = auVar10._0_8_;
  *(long *)(dst + stride * 3) = auVar6._0_8_;
  return;
}

Assistant:

void aom_h_predictor_8x4_sse2(uint8_t *dst, ptrdiff_t stride,
                              const uint8_t *above, const uint8_t *left) {
  (void)above;
  __m128i left_col = _mm_loadl_epi64((__m128i const *)left);
  left_col = _mm_unpacklo_epi8(left_col, left_col);
  __m128i row0 = _mm_shufflelo_epi16(left_col, 0);
  __m128i row1 = _mm_shufflelo_epi16(left_col, 0x55);
  __m128i row2 = _mm_shufflelo_epi16(left_col, 0xaa);
  __m128i row3 = _mm_shufflelo_epi16(left_col, 0xff);
  _mm_storel_epi64((__m128i *)dst, row0);
  dst += stride;
  _mm_storel_epi64((__m128i *)dst, row1);
  dst += stride;
  _mm_storel_epi64((__m128i *)dst, row2);
  dst += stride;
  _mm_storel_epi64((__m128i *)dst, row3);
}